

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O0

bool ImGui::SmallButtonTooltip(char *label,char *tip,ImU32 colFg,ImU32 colBg)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  ImVec2 *in_RDI;
  ImU32 unaff_retaddr;
  ImGuiStyleVar unaff_retaddr_00;
  bool b;
  ImGuiHoveredFlags in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int count;
  byte bVar2;
  ImVec2 local_28;
  float in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  
  if (in_EDX != 0x10101) {
    PushStyleColor(unaff_retaddr_00,unaff_retaddr);
  }
  if (in_ECX != 0x10101) {
    PushStyleColor(unaff_retaddr_00,unaff_retaddr);
  }
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0,0.0,0.0);
  PushStyleVar(unaff_retaddr_00,in_RDI);
  ImVec2::ImVec2(&local_28,0.0,0.0);
  PushStyleVar(unaff_retaddr_00,in_RDI);
  bVar1 = SmallButton((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  count = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffd4);
  PopStyleVar((int)in_stack_ffffffffffffffe4);
  if (in_ECX != 0x10101) {
    PopStyleColor(count);
  }
  if (in_EDX != 0x10101) {
    PopStyleColor(count);
  }
  bVar2 = (byte)((uint)count >> 0x18);
  if ((in_RSI != 0) && (bVar1 = IsItemHovered(in_stack_ffffffffffffffd0), bVar1)) {
    SetTooltip("%s",in_RSI);
  }
  return (bool)(bVar2 & 1);
}

Assistant:

IMGUI_API bool SmallButtonTooltip(const char* label,
                                  const char* tip,
                                  ImU32 colFg,
                                  ImU32 colBg)
{
    // Setup colors
    if (colFg != IM_COL32(1,1,1,0))
        PushStyleColor(ImGuiCol_Text, colFg);
    if (colBg != IM_COL32(1,1,1,0))
        PushStyleColor(ImGuiCol_Button, colBg);

    // do the button (and we _really_ using also x frame padding = 0)
    ImGui::PushStyleVar(ImGuiStyleVar_FramePadding, ImVec2(0.0f,0.0f));
    ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(0.0f,0.0f));
    bool b = SmallButton(label);
    ImGui::PopStyleVar(2);
    
    // restore previous colors
    if (colBg != IM_COL32(1,1,1,0))
        PopStyleColor();
    if (colFg != IM_COL32(1,1,1,0))
        PopStyleColor();

    // do the tooltip
    if (tip && IsItemHovered())
        SetTooltip("%s", tip);
    
    // return if button pressed
    return b;
}